

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
libcellml::Units::addUnit
          (Units *this,StandardUnit standardUnit,int prefix,double exponent,double multiplier,
          string *id)

{
  mapped_type *reference;
  int value;
  string local_50;
  string *local_30;
  string *id_local;
  double multiplier_local;
  double exponent_local;
  int prefix_local;
  StandardUnit standardUnit_local;
  Units *this_local;
  
  local_30 = id;
  id_local = (string *)multiplier;
  multiplier_local = exponent;
  exponent_local._0_4_ = prefix;
  exponent_local._4_4_ = standardUnit;
  _prefix_local = this;
  reference = std::
              map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at((map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)standardUnitToString_abi_cxx11_,(key_type *)((long)&exponent_local + 4));
  convertToString_abi_cxx11_(&local_50,(libcellml *)(ulong)exponent_local._0_4_,value);
  addUnit(this,reference,&local_50,multiplier_local,(double)id_local,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Units::addUnit(StandardUnit standardUnit, int prefix, double exponent,
                    double multiplier, const std::string &id)
{
    addUnit(standardUnitToString.at(standardUnit), convertToString(prefix), exponent, multiplier, id);
}